

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O3

int amqp_connection_get_session_handle
              (AMQP_CONNECTION_HANDLE conn_handle,SESSION_HANDLE *session_handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (conn_handle == (AMQP_CONNECTION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x199;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x199;
    }
    pcVar4 = "amqp_connection_get_session_handle failed (conn_handle is NULL)";
    iVar2 = 0x19a;
  }
  else {
    if (session_handle != (SESSION_HANDLE *)0x0) {
      *session_handle = conn_handle->session_handle;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x19e;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x19e;
    }
    pcVar4 = "amqp_connection_get_session_handle failed (session_handle is NULL)";
    iVar2 = 0x19f;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
            ,"amqp_connection_get_session_handle",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int amqp_connection_get_session_handle(AMQP_CONNECTION_HANDLE conn_handle, SESSION_HANDLE* session_handle)
{
    int result;

    if (conn_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("amqp_connection_get_session_handle failed (conn_handle is NULL)");
    }
    else if (session_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("amqp_connection_get_session_handle failed (session_handle is NULL)");
    }
    else
    {
        AMQP_CONNECTION_INSTANCE* instance = (AMQP_CONNECTION_INSTANCE*)conn_handle;

        *session_handle = instance->session_handle;

        result = RESULT_OK;
    }

    return result;
}